

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

int bitstream_w_memcpy(bitstream_w *stream,void *src,size_t bytes)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = stream->bit_offset;
  if ((uVar2 & 7) != 0) {
    uVar2 = (uVar2 & 0xfffffffffffffff8) + 8;
    stream->bit_offset = uVar2;
  }
  iVar1 = -1;
  if ((uVar2 >> 3) + bytes <= stream->length) {
    memcpy((void *)((uVar2 >> 3) + (long)stream->ptr),src,bytes);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
bitstream_w_memcpy(struct bitstream_w *stream, const void *src, size_t bytes) {
  size_t offset;
  uint8_t *buffer;

  bitstream_w_pad(stream);
  offset = stream->bit_offset / 8;

  if (offset + bytes > stream->length) {
    return -1;
  }

  buffer = stream->ptr;

  memcpy(&buffer[offset], src, bytes);
  offset += bytes * 8;
  return 0;
}